

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeResumeThrow<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *p_Var1;
  __index_type *__rhs;
  undefined1 local_f8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  undefined1 local_b0 [8];
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  _val_2;
  undefined1 auStack_80 [8];
  Result<wasm::Name> exnTag;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  resumetable;
  
  _val_2.val.
  super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
  .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
  super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
  super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
  super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
  super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
  _32_8_ = annotations;
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_f8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)auStack_80,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_f8);
  if (exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),(string *)auStack_80);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_80);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_80);
    tagidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)auStack_80,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
               ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_80);
    if (resumetable.val.
        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)local_b0,
                 (string *)
                 ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      makeResumeTable<wasm::WATParser::ParseDefsCtx>
                ((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                  *)((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                            super__Move_assign_alias<wasm::Name,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),ctx);
      __rhs = (__index_type *)
              ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         *)local_b0,
                        (_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         *)__rhs);
      if (_val_2.val.
          super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          ._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20),(string *)local_b0);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20));
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                             *)local_b0);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                             *)local_b0);
        p_Var1 = auStack_80;
        if (exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
          p_Var1 = (__index_type *)0x0;
        }
        if (resumetable.val.
            super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            ._M_u._24_1_ != '\0') {
          __rhs = (__index_type *)0x0;
        }
        ParseDefsCtx::makeResumeThrow
                  (__return_storage_ptr__,ctx,pos,
                   (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)_val_2.val.
                      super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      ._32_8_,(HeapType)local_f8,(IString)*(IString *)p_Var1,
                   (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    *)__rhs);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                           *)((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeResumeThrow(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto exnTag = tagidx(ctx);
  CHECK_ERR(exnTag);

  auto resumetable = makeResumeTable(ctx);
  CHECK_ERR(resumetable);

  return ctx.makeResumeThrow(pos, annotations, *type, *exnTag, *resumetable);
}